

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)63,_(unsigned_short)3>::Unpack
               (uint32_t **in,uint64_t *out)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  
  puVar3 = *in;
  uVar1 = puVar3[2];
  out[3] = (ulong)(uVar1 & 0xfffffff) << 0x23 | (ulong)(*puVar3 >> 0x1d) + (ulong)puVar3[1] * 8;
  uVar2 = puVar3[3];
  *in = puVar3 + 4;
  out[4] = (ulong)(puVar3[4] & 0x7ffffff) << 0x24 | (ulong)uVar2 << 4 | (ulong)(uVar1 >> 0x1c);
  Unroller<(unsigned_short)63,_(unsigned_short)5>::Unpack(in,out);
  return;
}

Assistant:

unpack_single_out(const uint32_t *__restrict &in,
                                                                     uint64_t *__restrict out) {
	*out = static_cast<uint64_t>(*in) >> SHR;
	++in;

	*out |= static_cast<uint64_t>(*in) << (32 - SHR);
	++in;

	if (DELTA + SHR > 64) {
		static const uint8_t NEXT_SHR = DELTA + SHR - 64;
		*out |= static_cast<uint64_t>((*in) % (1U << NEXT_SHR)) << (64 - SHR);
	}
}